

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::updateGeometries(QListView *this)

{
  QPersistentModelIndex *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Representation RVar5;
  QListViewPrivate *this_01;
  QWidgetData *pQVar6;
  QAbstractItemModel *pQVar7;
  int iVar8;
  ScrollBarPolicy SVar9;
  QWidget *pQVar10;
  QScrollBar *pQVar11;
  QSize QVar12;
  QSize QVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QSize step;
  QStyleOptionViewItem option;
  QSize local_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar6 = (this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data
  ;
  uVar1 = (pQVar6->crect).x1;
  uVar3 = (pQVar6->crect).y1;
  uVar2 = (pQVar6->crect).x2;
  uVar4 = (pQVar6->crect).y2;
  auVar14._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar14._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  iVar8 = movmskpd((int)pQVar6,auVar14);
  if (iVar8 == 0) {
    pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_108,this_00);
    iVar8 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7);
    if (iVar8 < 1) goto LAB_00579ce1;
    pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_128,this_00);
    iVar8 = (**(code **)(*(long *)pQVar7 + 0x80))(pQVar7);
    if (iVar8 < 1) goto LAB_00579ce1;
    local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar8 = this_01->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_108,this_00);
    (**(code **)(*(long *)pQVar7 + 0x60))(&local_128,pQVar7,0,iVar8,&local_108);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_130 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_130 = QListViewPrivate::itemSize(this_01,&local_108,(QModelIndex *)&local_128);
    (*this_01->commonListView->_vptr_QCommonListViewBase[0xf])(this_01->commonListView,&local_130);
    (*this_01->commonListView->_vptr_QCommonListViewBase[0x10])();
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  else {
LAB_00579ce1:
    pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar11->super_QAbstractSlider,0,0);
    pQVar11 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar11->super_QAbstractSlider,0,0);
  }
  QAbstractItemView::updateGeometries((QAbstractItemView *)this);
  if ((this_01->movement == Static) && (this_01->wrap == false)) {
    QAbstractScrollAreaPrivate::layoutChildren((QAbstractScrollAreaPrivate *)this_01);
    if (this_01->flow == TopToBottom) {
      SVar9 = QAbstractScrollArea::horizontalScrollBarPolicy((QAbstractScrollArea *)this);
      if (SVar9 != ScrollBarAlwaysOff) goto LAB_00579de4;
      pQVar10 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QVar12.wd.m_i = ((pQVar10->data->crect).x2.m_i - (pQVar10->data->crect).x1.m_i) + 1;
      QVar12.ht.m_i =
           *(int *)(*(long *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget.field_0x8 + 0x540) + 0x1c);
      this_01->commonListView->contentsSize = QVar12;
      pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    }
    else {
      SVar9 = QAbstractScrollArea::verticalScrollBarPolicy((QAbstractScrollArea *)this);
      if (SVar9 != ScrollBarAlwaysOff) goto LAB_00579de4;
      RVar5.m_i = *(int *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                               field_0x8 + 0x540) + 0x18);
      pQVar10 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QVar13.ht.m_i = ((pQVar10->data->crect).y2.m_i - (pQVar10->data->crect).y1.m_i) + 1;
      QVar13.wd.m_i = RVar5.m_i;
      this_01->commonListView->contentsSize = QVar13;
      pQVar11 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    }
    QAbstractSlider::setRange(&pQVar11->super_QAbstractSlider,0,0);
  }
LAB_00579de4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::updateGeometries()
{
    Q_D(QListView);
    if (geometry().isEmpty() || d->model->rowCount(d->root) <= 0 || d->model->columnCount(d->root) <= 0) {
        horizontalScrollBar()->setRange(0, 0);
        verticalScrollBar()->setRange(0, 0);
    } else {
        QModelIndex index = d->model->index(0, d->column, d->root);
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        QSize step = d->itemSize(option, index);
        d->commonListView->updateHorizontalScrollBar(step);
        d->commonListView->updateVerticalScrollBar(step);
    }

    QAbstractItemView::updateGeometries();

    // if the scroll bars are turned off, we resize the contents to the viewport
    if (d->movement == Static && !d->isWrapping()) {
        d->layoutChildren(); // we need the viewport size to be updated
        if (d->flow == TopToBottom) {
            if (horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff) {
                d->setContentsSize(viewport()->width(), contentsSize().height());
                horizontalScrollBar()->setRange(0, 0); // we see all the contents anyway
            }
        } else { // LeftToRight
            if (verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff) {
                d->setContentsSize(contentsSize().width(), viewport()->height());
                verticalScrollBar()->setRange(0, 0); // we see all the contents anyway
            }
        }
    }

}